

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

bool chaiscript::Boxed_Number::greater_than_equal(Boxed_Number *t_lhs,Boxed_Number *t_rhs)

{
  bool bVar1;
  Boxed_Number local_30;
  anon_class_24_3_1b4046b4 local_20;
  
  local_20.t_oper = greater_than_equal;
  local_20.t_lhs = &t_lhs->bv;
  local_20.t_rhs = &t_rhs->bv;
  visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
            (&local_30,&t_lhs->bv,&local_20);
  bVar1 = boxed_cast<bool>(&local_30.bv,(Type_Conversions_State *)0x0);
  if (local_30.bv.m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.bv.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

static bool greater_than_equal(const Boxed_Number &t_lhs, const Boxed_Number &t_rhs) {
      return boxed_cast<bool>(oper(Operators::Opers::greater_than_equal, t_lhs.bv, t_rhs.bv));
    }